

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::AppendProperty(cmTarget *this,string *prop,char *value,bool asString)

{
  TargetType tgtType;
  cmMakefile *pcVar1;
  cmTargetInternals *pcVar2;
  bool bVar3;
  int iVar4;
  cmMessenger *messenger;
  ostream *poVar5;
  size_t sVar6;
  ostringstream e;
  allocator local_1c9;
  string local_1c8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [360];
  
  tgtType = this->TargetTypeValue;
  messenger = cmMakefile::GetMessenger(this->Makefile);
  cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a8,this->Makefile);
  bVar3 = cmTargetPropertyComputer::PassesWhitelist
                    (tgtType,prop,messenger,(cmListFileBacktrace *)local_1a8);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1a8);
  if (!bVar3) {
    return;
  }
  iVar4 = std::__cxx11::string::compare((char *)prop);
  if (iVar4 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"NAME property is read-only\n",0x1b);
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)prop);
    if ((iVar4 == 0) && (this->IsImportedTarget == true)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"EXPORT_NAME property can\'t be set on imported targets (\"",
                 0x38);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                          (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)prop);
      if ((iVar4 != 0) || (this->IsImportedTarget != true)) {
        iVar4 = std::__cxx11::string::compare((char *)prop);
        if (iVar4 == 0) {
          if (value == (char *)0x0) {
            return;
          }
          if (*value == '\0') {
            return;
          }
          pcVar2 = (this->Internal).Pointer;
          local_1a8._0_8_ = (cmState *)local_198;
          sVar6 = strlen(value);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,value,value + sVar6);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pcVar2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8)
          ;
          if ((cmState *)local_1a8._0_8_ != (cmState *)local_198) {
            operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
          }
          cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a8,this->Makefile);
          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                    (&((this->Internal).Pointer)->IncludeDirectoriesBacktraces,
                     (cmListFileBacktrace *)local_1a8);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)prop);
          if (iVar4 == 0) {
            if (value == (char *)0x0) {
              return;
            }
            if (*value == '\0') {
              return;
            }
            pcVar2 = (this->Internal).Pointer;
            local_1a8._0_8_ = (cmState *)local_198;
            sVar6 = strlen(value);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,value,value + sVar6)
            ;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &pcVar2->CompileOptionsEntries,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8);
            if ((cmState *)local_1a8._0_8_ != (cmState *)local_198) {
              operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
            }
            cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a8,this->Makefile);
            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                      (&((this->Internal).Pointer)->CompileOptionsBacktraces,
                       (cmListFileBacktrace *)local_1a8);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)prop);
            if (iVar4 == 0) {
              if (value == (char *)0x0) {
                return;
              }
              if (*value == '\0') {
                return;
              }
              pcVar2 = (this->Internal).Pointer;
              local_1a8._0_8_ = (cmState *)local_198;
              sVar6 = strlen(value);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1a8,value,value + sVar6);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &pcVar2->CompileFeaturesEntries,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8);
              if ((cmState *)local_1a8._0_8_ != (cmState *)local_198) {
                operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
              }
              cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a8,this->Makefile);
              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                        (&((this->Internal).Pointer)->CompileFeaturesBacktraces,
                         (cmListFileBacktrace *)local_1a8);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)prop);
              if (iVar4 == 0) {
                if (value == (char *)0x0) {
                  return;
                }
                if (*value == '\0') {
                  return;
                }
                pcVar2 = (this->Internal).Pointer;
                local_1a8._0_8_ = (cmState *)local_198;
                sVar6 = strlen(value);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,value,value + sVar6);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &pcVar2->CompileDefinitionsEntries,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8);
                if ((cmState *)local_1a8._0_8_ != (cmState *)local_198) {
                  operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
                }
                cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a8,this->Makefile);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&((this->Internal).Pointer)->CompileDefinitionsBacktraces,
                           (cmListFileBacktrace *)local_1a8);
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)prop);
                if (iVar4 == 0) {
                  if (value == (char *)0x0) {
                    return;
                  }
                  if (*value == '\0') {
                    return;
                  }
                  cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a8,this->Makefile);
                  pcVar2 = (this->Internal).Pointer;
                  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                  sVar6 = strlen(value);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_1c8,value,value + sVar6);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &pcVar2->LinkImplementationPropertyEntries,&local_1c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                    operator_delete(local_1c8._M_dataplus._M_p,
                                    local_1c8.field_2._M_allocated_capacity + 1);
                  }
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                            (&((this->Internal).Pointer)->LinkImplementationPropertyBacktraces,
                             (value_type *)local_1a8);
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)prop);
                  if (iVar4 != 0) {
                    iVar4 = strncmp((prop->_M_dataplus)._M_p,"IMPORTED_LIBNAME",0x10);
                    if (iVar4 != 0) {
                      cmPropertyMap::AppendProperty(&this->Properties,prop,value,asString);
                      return;
                    }
                    pcVar1 = this->Makefile;
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1a8,prop," property may not be APPENDed.");
                    cmMakefile::IssueMessage
                              (pcVar1,FATAL_ERROR,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1a8);
                    if ((cmState *)local_1a8._0_8_ == (cmState *)local_198) {
                      return;
                    }
                    operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
                    return;
                  }
                  cmMakefile::GetBacktrace((cmListFileBacktrace *)local_1a8,this->Makefile);
                  pcVar2 = (this->Internal).Pointer;
                  std::__cxx11::string::string((string *)&local_1c8,value,&local_1c9);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &pcVar2->SourceEntries,&local_1c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                    operator_delete(local_1c8._M_dataplus._M_p,
                                    local_1c8.field_2._M_allocated_capacity + 1);
                  }
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                            (&((this->Internal).Pointer)->SourceBacktraces,(value_type *)local_1a8);
                }
              }
            }
          }
        }
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1a8);
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"SOURCES property can\'t be set on imported targets (\"",0x34)
      ;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                          (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x60));
  return;
}

Assistant:

void cmTarget::AppendProperty(const std::string& prop, const char* value,
                              bool asString)
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, this->Makefile->GetMessenger(),
        this->Makefile->GetBacktrace())) {
    return;
  }
  if (prop == "NAME") {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "EXPORT_NAME" && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "SOURCES" && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\"" << this->Name
      << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    if (value && *value) {
      this->Internal->IncludeDirectoriesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->IncludeDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_OPTIONS") {
    if (value && *value) {
      this->Internal->CompileOptionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_FEATURES") {
    if (value && *value) {
      this->Internal->CompileFeaturesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileFeaturesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_DEFINITIONS") {
    if (value && *value) {
      this->Internal->CompileDefinitionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileDefinitionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_LIBRARIES") {
    if (value && *value) {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkImplementationPropertyEntries.push_back(value);
      this->Internal->LinkImplementationPropertyBacktraces.push_back(lfbt);
    }
  } else if (prop == "SOURCES") {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    this->Internal->SourceEntries.push_back(value);
    this->Internal->SourceBacktraces.push_back(lfbt);
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME")) {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR,
                                 prop + " property may not be APPENDed.");
  } else {
    this->Properties.AppendProperty(prop, value, asString);
  }
}